

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O2

int64_t calc_level_size(int64_t mind,int64_t maxd,int level,exr_tile_round_mode_t rounding)

{
  long lVar1;
  
  lVar1 = ((maxd - mind) + 1) / (1L << ((byte)level & 0x3f));
  lVar1 = lVar1 + (ulong)(lVar1 << ((byte)level & 0x3f) <= maxd - mind &&
                         rounding == EXR_TILE_ROUND_UP);
  if (lVar1 < 2) {
    lVar1 = 1;
  }
  return lVar1;
}

Assistant:

static int64_t
calc_level_size (
    int64_t mind, int64_t maxd, int level, exr_tile_round_mode_t rounding)
{
    int64_t dsize   = (int64_t) maxd - (int64_t) mind + 1;
    int64_t b       = ((int64_t) 1) << level;
    int64_t retsize = dsize / b;

    if (rounding == EXR_TILE_ROUND_UP && retsize * b < dsize) retsize += 1;

    if (retsize < 1) retsize = 1;
    return retsize;
}